

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subdivision.cpp
# Opt level: O2

void __thiscall
CatmullClarkSubdivider::InternSubdivide
          (CatmullClarkSubdivider *this,aiMesh **smesh,size_t nmesh,aiMesh **out,uint num)

{
  pointer ppVar1;
  aiFace *paVar2;
  float fVar3;
  uint uVar4;
  aiMesh *paVar5;
  float fVar6;
  pointer puVar7;
  bool bVar8;
  uint uVar9;
  size_t t_1;
  ulong uVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  Logger *this_00;
  aiMesh *this_01;
  ulong *puVar13;
  aiVector3D *paVar14;
  void *__s;
  aiColor4D *__s_00;
  uint *puVar15;
  mapped_type *pmVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  aiFace *paVar21;
  ulong uVar22;
  aiMesh *paVar23;
  aiMesh **ppaVar24;
  ulong uVar25;
  int iVar26;
  aiFace *paVar27;
  Vertex *pVVar28;
  ulong uVar29;
  uint i;
  ulong uVar30;
  uint a;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  size_t t;
  size_t sVar35;
  ai_real pRadius;
  float fVar36;
  uint local_a9c;
  int local_a78;
  UIntVector maptbl;
  uint local_a44;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  moffsets;
  UIntVector cntadjfac;
  UIntVector ofsadjvec;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> centroids;
  UIntVector faceadjac;
  EdgeMap edges;
  vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
  new_points;
  SpatialSort spatial;
  Vertex F;
  Vertex R;
  Vertex local_690;
  Vertex local_580;
  Vertex local_470;
  Vertex local_360;
  Vertex local_250;
  Vertex local_140;
  
  if ((smesh == (aiMesh **)0x0) || (out == (aiMesh **)0x0)) {
    __assert_fail("__null != smesh && __null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                  ,0xec,
                  "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                 );
  }
  if (num != 0) {
    maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Assimp::SpatialSort::SpatialSort(&spatial);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::vector(&moffsets,nmesh,(allocator_type *)&F);
    uVar31 = 0;
    local_a9c = 0;
    for (sVar35 = 0; nmesh != sVar35; sVar35 = sVar35 + 1) {
      paVar5 = smesh[sVar35];
      Assimp::SpatialSort::Append(&spatial,paVar5->mVertices,paVar5->mNumVertices,0xc,false);
      moffsets.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar35].first = local_a9c;
      moffsets.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar35].second = uVar31;
      local_a9c = local_a9c + paVar5->mNumFaces;
      uVar31 = uVar31 + paVar5->mNumVertices;
    }
    Assimp::SpatialSort::Finalize(&spatial);
    pRadius = Assimp::ComputePositionEpsilon(smesh,nmesh);
    uVar9 = Assimp::SpatialSort::GenerateMappingTable(&spatial,&maptbl,pRadius);
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::vector
              (&centroids,(ulong)local_a9c,(allocator_type *)&F);
    lVar20 = 0;
    uVar31 = 0;
    for (sVar35 = 0; sVar35 != nmesh; sVar35 = sVar35 + 1) {
      paVar5 = smesh[sVar35];
      for (uVar30 = 0; uVar30 < paVar5->mNumFaces; uVar30 = uVar30 + 1) {
        paVar27 = paVar5->mFaces + uVar30;
        pVVar28 = centroids.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar20;
        for (uVar32 = 0; uVar32 < paVar27->mNumIndices; uVar32 = uVar32 + 1) {
          Assimp::Vertex::Vertex(&F,paVar5,paVar27->mIndices[uVar32]);
          Assimp::Vertex::operator+=(pVVar28,&F);
        }
        Assimp::Vertex::operator/=(pVVar28,(float)paVar27->mNumIndices);
        uVar31 = uVar31 + paVar27->mNumIndices;
        lVar20 = lVar20 + 1;
      }
    }
    edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &edges._M_t._M_impl.super__Rb_tree_header._M_header;
    edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (sVar35 = 0; sVar35 != nmesh; sVar35 = sVar35 + 1) {
      paVar5 = smesh[sVar35];
      for (uVar30 = 0; uVar30 < paVar5->mNumFaces; uVar30 = uVar30 + 1) {
        paVar27 = paVar5->mFaces;
        uVar32 = 0;
        while (uVar33 = paVar27[uVar30].mNumIndices, uVar32 < uVar33) {
          puVar15 = paVar27[uVar30].mIndices;
          uVar19 = puVar15[uVar32];
          uVar29 = uVar32 + 1;
          uVar10 = 0;
          if (uVar32 != uVar33 - 1) {
            uVar10 = uVar29;
          }
          uVar33 = puVar15[uVar10];
          fVar36 = (float)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [moffsets.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar35].second + uVar19];
          fVar3 = (float)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [moffsets.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar35].second + uVar33];
          fVar6 = fVar3;
          if ((uint)fVar36 < (uint)fVar3) {
            fVar6 = fVar36;
          }
          if ((uint)fVar3 < (uint)fVar36) {
            fVar3 = fVar36;
          }
          F.position.y = fVar6;
          F.position.x = fVar3;
          pmVar11 = std::
                    map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                    ::operator[](&edges,(key_type_conflict1 *)&F);
          uVar4 = pmVar11->ref;
          uVar34 = uVar4 + 1;
          pmVar11->ref = uVar34;
          uVar32 = uVar29;
          if (uVar34 < 3) {
            if (uVar4 == 0) {
              Assimp::Vertex::Vertex(&R,paVar5,uVar19);
              Assimp::Vertex::Vertex(&local_690,paVar5,uVar33);
              Assimp::Vertex::BinaryOp<std::plus>(&F,&R,&local_690);
              memcpy(&pmVar11->midpoint,&F,0x110);
              memcpy(pmVar11,&F,0x110);
              Assimp::Vertex::operator*=(&pmVar11->midpoint,0.5);
            }
            local_a78 = (int)uVar30;
            Assimp::Vertex::operator+=
                      (&pmVar11->edge_point,
                       centroids.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (moffsets.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar35].first + local_a78));
          }
        }
      }
    }
    iVar26 = 0;
    for (p_Var12 = edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var12 != &edges._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      uVar33 = *(uint *)&p_Var12[0x12]._M_parent;
      if (uVar33 < 2) {
        if (uVar33 == 0) {
          __assert_fail("(*it).second.ref",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                        ,0x150,
                        "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                       );
        }
        iVar26 = iVar26 + 1;
      }
      Assimp::Vertex::operator*=((Vertex *)&p_Var12[1]._M_parent,1.0 / ((float)uVar33 + 2.0));
    }
    if (iVar26 != 0) {
      this_00 = Assimp::DefaultLogger::get();
      Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[31]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&F,
                 (char (*) [31])"Catmull-Clark Subdivider: got ");
      std::ostream::_M_insert<unsigned_long>((ulong)&F);
      std::operator<<((ostream *)&F," bad edges touching only one face (totally ");
      std::ostream::_M_insert<unsigned_long>((ulong)&F);
      std::operator<<((ostream *)&F," edges). ");
      std::__cxx11::stringbuf::str();
      Assimp::Logger::debug(this_00,(char *)R.position._0_8_);
      std::__cxx11::string::~string((string *)&R);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&F);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&faceadjac,(ulong)uVar31,(allocator_type *)&F);
    F.position._0_8_ = F.position._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&cntadjfac,
               (long)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict4 *)&F,
               (allocator_type *)&R);
    F.position._0_8_ = F.position._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&ofsadjvec,
               ((long)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start >> 2) + 1,(value_type_conflict4 *)&F,
               (allocator_type *)&R);
    for (sVar35 = 0; sVar35 != nmesh; sVar35 = sVar35 + 1) {
      paVar5 = smesh[sVar35];
      for (uVar30 = 0; uVar30 < paVar5->mNumFaces; uVar30 = uVar30 + 1) {
        paVar27 = paVar5->mFaces + uVar30;
        for (uVar32 = 0; uVar32 < paVar27->mNumIndices; uVar32 = uVar32 + 1) {
          cntadjfac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start
          [maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start
           [paVar27->mIndices[uVar32] +
            moffsets.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar35].second]] =
               cntadjfac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start
               [maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start
                [paVar27->mIndices[uVar32] +
                 moffsets.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar35].second]] + 1;
        }
      }
    }
    uVar31 = 0;
    for (uVar30 = 0;
        uVar30 < (ulong)((long)cntadjfac.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)cntadjfac.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2); uVar30 = uVar30 + 1)
    {
      ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar30 + 1] = uVar31;
      uVar31 = uVar31 + cntadjfac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar30];
    }
    for (sVar35 = 0; sVar35 != nmesh; sVar35 = sVar35 + 1) {
      paVar5 = smesh[sVar35];
      for (uVar30 = 0; uVar30 < paVar5->mNumFaces; uVar30 = uVar30 + 1) {
        paVar27 = paVar5->mFaces + uVar30;
        for (uVar32 = 0; uVar32 < paVar27->mNumIndices; uVar32 = uVar32 + 1) {
          uVar31 = moffsets.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar35].first;
          uVar33 = ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start
                   [maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [paVar27->mIndices[uVar32] +
                     moffsets.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar35].second] + 1];
          ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start
          [maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start
           [paVar27->mIndices[uVar32] +
            moffsets.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar35].second] + 1] = uVar33 + 1;
          faceadjac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar33] = uVar31 + (int)uVar30;
        }
      }
    }
    for (lVar20 = 0;
        lVar20 != ((long)ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2) + -1; lVar20 = lVar20 + 1) {
      for (uVar31 = 0;
          uVar31 != cntadjfac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar20]; uVar31 = uVar31 + 1) {
        uVar33 = faceadjac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar20] + uVar31];
        uVar30 = 1;
        if (local_a9c <= uVar33) {
          __assert_fail("fidx < totfaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                        ,0x185,
                        "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                       );
        }
        while( true ) {
          if (nmesh <= uVar30) goto LAB_005e86ac;
          if (uVar33 < moffsets.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar30].first) break;
          uVar30 = uVar30 + 1;
        }
        uVar33 = uVar33 - moffsets.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar30 - 1].first;
        uVar32 = 0;
        do {
          if (smesh[uVar30 - 1]->mFaces[uVar33].mNumIndices == uVar32) {
            __assert_fail("haveit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                          ,0x193,
                          "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                         );
          }
          puVar15 = smesh[uVar30 - 1]->mFaces[uVar33].mIndices + uVar32;
          uVar32 = uVar32 + 1;
        } while (maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [*puVar15 +
                  moffsets.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar30 - 1].second] != (uint)lVar20);
LAB_005e86ac:
      }
    }
    memset(&F.position.y,0,0x110);
    F.position._0_8_ = F.position._0_8_ & 0xffffffffffffff00;
    std::vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
    ::vector(&new_points,(ulong)uVar9,(value_type *)&F,(allocator_type *)&R);
    for (sVar35 = 0; sVar35 != nmesh; sVar35 = sVar35 + 1) {
      paVar5 = smesh[sVar35];
      this_01 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_01);
      out[sVar35] = this_01;
      lVar20 = 0;
      for (uVar30 = 0; uVar30 < paVar5->mNumFaces; uVar30 = uVar30 + 1) {
        this_01->mNumFaces =
             this_01->mNumFaces + *(int *)((long)&paVar5->mFaces->mNumIndices + lVar20);
        lVar20 = lVar20 + 0x10;
      }
      uVar31 = this_01->mNumFaces;
      uVar30 = (ulong)uVar31;
      puVar13 = (ulong *)operator_new__(uVar30 * 0x10 + 8);
      *puVar13 = uVar30;
      paVar27 = (aiFace *)(puVar13 + 1);
      if (uVar30 != 0) {
        paVar21 = paVar27;
        do {
          paVar21->mNumIndices = 0;
          paVar21->mIndices = (uint *)0x0;
          paVar21 = paVar21 + 1;
        } while (paVar21 != paVar27 + uVar30);
      }
      this_01->mFaces = paVar27;
      uVar9 = uVar31 << 2;
      this_01->mNumVertices = uVar9;
      uVar30 = (ulong)uVar9 * 0xc;
      paVar14 = (aiVector3D *)operator_new__(uVar30);
      if ((uVar31 & 0x3fffffff) != 0) {
        memset(paVar14,0,((uVar30 - 0xc) - (uVar30 - 0xc) % 0xc) + 0xc);
      }
      this_01->mVertices = paVar14;
      this_01->mPrimitiveTypes = 8;
      this_01->mMaterialIndex = paVar5->mMaterialIndex;
      if ((paVar5->mNormals != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
        paVar14 = (aiVector3D *)operator_new__(uVar30);
        if (uVar9 != 0) {
          memset(paVar14,0,((uVar30 - 0xc) - (uVar30 - 0xc) % 0xc) + 0xc);
        }
        this_01->mNormals = paVar14;
      }
      bVar8 = aiMesh::HasTangentsAndBitangents(paVar5);
      if (bVar8) {
        uVar31 = this_01->mNumVertices;
        uVar30 = (ulong)uVar31 * 0xc;
        paVar14 = (aiVector3D *)operator_new__(uVar30);
        if (uVar31 != 0) {
          memset(paVar14,0,((uVar30 - 0xc) - (uVar30 - 0xc) % 0xc) + 0xc);
        }
        this_01->mTangents = paVar14;
        paVar14 = (aiVector3D *)operator_new__(uVar30);
        if (uVar31 != 0) {
          memset(paVar14,0,((uVar30 - 0xc) - (uVar30 - 0xc) % 0xc) + 0xc);
        }
        this_01->mBitangents = paVar14;
      }
      lVar20 = 0;
      while (((lVar20 != 0x20 && (*(long *)((long)paVar5->mTextureCoords + lVar20 * 2) != 0)) &&
             (paVar5->mNumVertices != 0))) {
        uVar31 = this_01->mNumVertices;
        uVar30 = (ulong)uVar31 * 0xc;
        __s = operator_new__(uVar30);
        if (uVar31 != 0) {
          uVar30 = uVar30 - 0xc;
          memset(__s,0,(uVar30 - uVar30 % 0xc) + 0xc);
        }
        *(void **)((long)this_01->mTextureCoords + lVar20 * 2) = __s;
        *(undefined4 *)((long)this_01->mNumUVComponents + lVar20) =
             *(undefined4 *)((long)paVar5->mNumUVComponents + lVar20);
        lVar20 = lVar20 + 4;
      }
      lVar20 = 6;
      while (((lVar20 != 0xe && (paVar5->mColors[lVar20 + -6] != (aiColor4D *)0x0)) &&
             (paVar5->mNumVertices != 0))) {
        uVar31 = this_01->mNumVertices;
        uVar30 = (ulong)uVar31 << 4;
        __s_00 = (aiColor4D *)operator_new__(uVar30);
        if (uVar31 != 0) {
          memset(__s_00,0,uVar30);
        }
        this_01->mColors[lVar20 + -6] = __s_00;
        lVar20 = lVar20 + 1;
      }
      this_01->mNumVertices = this_01->mNumFaces << 2;
      uVar31 = 0;
      local_a44 = 0;
      for (uVar30 = 0; uVar30 < paVar5->mNumFaces; uVar30 = uVar30 + 1) {
        paVar27 = paVar5->mFaces + uVar30;
        uVar32 = 0;
        while (uVar32 < paVar27->mNumIndices) {
          paVar21 = this_01->mFaces;
          uVar10 = (ulong)local_a44;
          paVar21[uVar10].mNumIndices = 4;
          puVar15 = (uint *)operator_new__(0x10);
          paVar21[uVar10].mIndices = puVar15;
          uVar9 = moffsets.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar35].first;
          *puVar15 = uVar31;
          Assimp::Vertex::SortBack
                    (centroids.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                     _M_impl.super__Vector_impl_data._M_start + (uVar9 + (int)uVar30),this_01,uVar31
                    );
          uVar29 = 0;
          if (uVar32 != paVar27->mNumIndices - 1) {
            uVar29 = uVar32 + 1 & 0xffffffff;
          }
          fVar36 = (float)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [paVar27->mIndices[uVar32] +
                           moffsets.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar35].second];
          fVar3 = (float)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [moffsets.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar35].second +
                          paVar27->mIndices[uVar29]];
          fVar6 = fVar3;
          if ((uint)fVar36 < (uint)fVar3) {
            fVar6 = fVar36;
          }
          if ((uint)fVar3 < (uint)fVar36) {
            fVar3 = fVar36;
          }
          F.position.y = fVar6;
          F.position.x = fVar3;
          pmVar11 = std::
                    map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                    ::operator[](&edges,(key_type_conflict1 *)&F);
          uVar9 = (uint)uVar32;
          if (uVar32 == 0) {
            uVar9 = paVar27->mNumIndices;
          }
          fVar36 = (float)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [paVar27->mIndices[uVar32] +
                           moffsets.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar35].second];
          fVar3 = (float)maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [moffsets.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar35].second +
                          paVar27->mIndices[uVar9 - 1]];
          fVar6 = fVar3;
          if ((uint)fVar36 < (uint)fVar3) {
            fVar6 = fVar36;
          }
          if ((uint)fVar3 < (uint)fVar36) {
            fVar3 = fVar36;
          }
          F.position.y = fVar6;
          F.position.x = fVar3;
          pmVar16 = std::
                    map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                    ::operator[](&edges,(key_type_conflict1 *)&F);
          paVar21[uVar10].mIndices[3] = uVar31 + 1;
          Assimp::Vertex::SortBack(&pmVar11->edge_point,this_01,uVar31 + 1);
          paVar21[uVar10].mIndices[1] = uVar31 + 2;
          Assimp::Vertex::SortBack(&pmVar16->edge_point,this_01,uVar31 + 2);
          puVar7 = faceadjac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar9 = maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [paVar27->mIndices[uVar32] +
                   moffsets.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar35].second];
          uVar29 = (ulong)uVar9;
          ppVar1 = new_points.
                   super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar29;
          pVVar28 = &F;
          if (new_points.
              super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar29].first == false) {
            ppVar1->first = true;
            uVar17 = (ulong)cntadjfac.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar29];
            if (uVar17 < 3) {
              Assimp::Vertex::Vertex(pVVar28,paVar5,paVar27->mIndices[uVar32]);
            }
            else {
              uVar33 = ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar29];
              memset(pVVar28,0,0x110);
              memset(&R,0,0x110);
              for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
                uVar19 = puVar7[uVar33 + uVar18];
                if (local_a9c <= uVar19) {
                  __assert_fail("adj[o] < totfaces",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                                ,0x202,
                                "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                               );
                }
                Assimp::Vertex::operator+=
                          (&F,centroids.
                              super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar19);
                uVar19 = puVar7[uVar33 + uVar18];
                if (uVar19 < (moffsets.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first) {
                  uVar25 = 0;
                  ppaVar24 = smesh;
LAB_005e8d35:
                  paVar23 = *ppaVar24;
                }
                else {
                  for (uVar25 = 1; uVar25 <= nmesh; uVar25 = uVar25 + 1) {
                    uVar22 = nmesh;
                    if ((uVar25 == nmesh) ||
                       (uVar22 = uVar25,
                       uVar19 < moffsets.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar25].first)) {
                      ppaVar24 = smesh + (uVar22 - 1);
                      uVar25 = uVar22 - 1;
                      goto LAB_005e8d35;
                    }
                  }
                  paVar23 = (aiMesh *)0x0;
                }
                uVar19 = uVar19 - moffsets.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].first;
                if (paVar23->mNumFaces <= uVar19) {
                  __assert_fail("adj[o]-moffsets[nidx].first < mp->mNumFaces",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                                ,0x215,
                                "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                               );
                }
                paVar2 = paVar23->mFaces + uVar19;
                uVar19 = paVar23->mFaces[uVar19].mNumIndices;
                uVar34 = 0;
                while( true ) {
                  if (uVar19 == uVar34) {
                    __assert_fail("haveit",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                                  ,0x232,
                                  "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                                 );
                  }
                  if (maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start
                      [paVar2->mIndices[uVar34] +
                       moffsets.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].second] == uVar9) break;
                  uVar34 = uVar34 + 1;
                }
                if (uVar34 != 0) {
                  uVar19 = uVar34;
                }
                uVar19 = maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [moffsets.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].second +
                          paVar2->mIndices[uVar19 - 1]];
                uVar22 = (ulong)uVar19;
                if (uVar9 < uVar19) {
                  uVar22 = uVar29;
                }
                if (uVar19 < uVar9) {
                  uVar19 = uVar9;
                }
                local_690.position._0_8_ = uVar22 << 0x20 | (ulong)uVar19;
                pmVar11 = std::
                          map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                          ::operator[](&edges,(key_type_conflict1 *)&local_690);
                uVar19 = uVar34 + 1;
                if (uVar34 - paVar2->mNumIndices == -1) {
                  uVar19 = 0;
                }
                uVar19 = maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [paVar2->mIndices[uVar19] +
                          moffsets.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].second];
                uVar34 = uVar19;
                if (uVar9 < uVar19) {
                  uVar34 = uVar9;
                }
                local_690.position._0_8_ = (ulong)uVar19;
                if (uVar19 < uVar9) {
                  local_690.position._0_8_ = uVar29;
                }
                local_690.position._0_8_ = (ulong)uVar34 << 0x20 | local_690.position._0_8_;
                pmVar16 = std::
                          map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                          ::operator[](&edges,(key_type_conflict1 *)&local_690);
                Assimp::Vertex::BinaryOp<std::plus>
                          (&local_690,&pmVar11->midpoint,&pmVar16->midpoint);
                Assimp::Vertex::operator+=(&R,&local_690);
              }
              Assimp::Vertex::Vertex(&local_140,paVar5,paVar27->mIndices[uVar32]);
              fVar36 = (float)uVar17;
              Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                        (&local_580,&local_140,(fVar36 + -3.0) / fVar36);
              fVar36 = 1.0 / (fVar36 * fVar36);
              Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>(&local_250,&R,fVar36);
              Assimp::Vertex::BinaryOp<std::plus>(&local_470,&local_580,&local_250);
              Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>(&local_360,&F,fVar36);
              pVVar28 = &local_690;
              Assimp::Vertex::BinaryOp<std::plus>(pVVar28,&local_470,&local_360);
            }
            memcpy(&ppVar1->second,pVVar28,0x110);
          }
          local_a44 = local_a44 + 1;
          uVar9 = uVar31 + 3;
          uVar31 = uVar31 + 4;
          paVar21[uVar10].mIndices[2] = uVar9;
          Assimp::Vertex::SortBack(&ppVar1->second,this_01,uVar9);
          uVar32 = uVar32 + 1;
        }
      }
    }
    std::
    _Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
    ::~_Vector_base(&new_points.
                     super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                   );
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&cntadjfac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&faceadjac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>,_std::_Select1st<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
    ::~_Rb_tree(&edges._M_t);
    if (num != 1) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&F,nmesh,(allocator_type *)&R);
      InternSubdivide(this,out,nmesh,(aiMesh **)F.position._0_8_,num - 1);
      for (sVar35 = 0; nmesh != sVar35; sVar35 = sVar35 + 1) {
        paVar5 = out[sVar35];
        if (paVar5 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar5);
        }
        operator_delete(paVar5);
        out[sVar35] = *(aiMesh **)(F.position._0_8_ + sVar35 * 8);
      }
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                ((_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> *)&F);
    }
    std::_Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::~_Vector_base
              (&centroids.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>);
    std::
    _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~_Vector_base(&moffsets.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   );
    Assimp::SpatialSort::~SpatialSort(&spatial);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return;
}

Assistant:

void CatmullClarkSubdivider::InternSubdivide (
    const aiMesh* const * smesh,
    size_t nmesh,
    aiMesh** out,
    unsigned int num
    )
{
    ai_assert(NULL != smesh && NULL != out);
    INIT_EDGE_HASH_TEMPORARIES();

    // no subdivision requested or end of recursive refinement
    if (!num) {
        return;
    }

    UIntVector maptbl;
    SpatialSort spatial;

    // ---------------------------------------------------------------------
    // 0. Offset table to index all meshes continuously, generate a spatially
    // sorted representation of all vertices in all meshes.
    // ---------------------------------------------------------------------
    typedef std::pair<unsigned int,unsigned int> IntPair;
    std::vector<IntPair> moffsets(nmesh);
    unsigned int totfaces = 0, totvert = 0;
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        spatial.Append(mesh->mVertices,mesh->mNumVertices,sizeof(aiVector3D),false);
        moffsets[t] = IntPair(totfaces,totvert);

        totfaces += mesh->mNumFaces;
        totvert  += mesh->mNumVertices;
    }

    spatial.Finalize();
    const unsigned int num_unique = spatial.GenerateMappingTable(maptbl,ComputePositionEpsilon(smesh,nmesh));


#define FLATTEN_VERTEX_IDX(mesh_idx, vert_idx) (moffsets[mesh_idx].second+vert_idx)
#define   FLATTEN_FACE_IDX(mesh_idx, face_idx) (moffsets[mesh_idx].first+face_idx)

    // ---------------------------------------------------------------------
    // 1. Compute the centroid point for all faces
    // ---------------------------------------------------------------------
    std::vector<Vertex> centroids(totfaces);
    unsigned int nfacesout = 0;
    for (size_t t = 0, n = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];
        for (unsigned int i = 0; i < mesh->mNumFaces;++i,++n)
        {
            const aiFace& face = mesh->mFaces[i];
            Vertex& c = centroids[n];

            for (unsigned int a = 0; a < face.mNumIndices;++a) {
                c += Vertex(mesh,face.mIndices[a]);
            }

            c /= static_cast<float>(face.mNumIndices);
            nfacesout += face.mNumIndices;
        }
    }

    {
    // we want edges to go away before the recursive calls so begin a new scope
    EdgeMap edges;

    // ---------------------------------------------------------------------
    // 2. Set each edge point to be the average of all neighbouring
    // face points and original points. Every edge exists twice
    // if there is a neighboring face.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        for (unsigned int i = 0; i < mesh->mNumFaces;++i)   {
            const aiFace& face = mesh->mFaces[i];

            for (unsigned int p =0; p< face.mNumIndices; ++p) {
                const unsigned int id[] = {
                    face.mIndices[p],
                    face.mIndices[p==face.mNumIndices-1?0:p+1]
                };
                const unsigned int mp[] = {
                    maptbl[FLATTEN_VERTEX_IDX(t,id[0])],
                    maptbl[FLATTEN_VERTEX_IDX(t,id[1])]
                };

                Edge& e = edges[MAKE_EDGE_HASH(mp[0],mp[1])];
                e.ref++;
                if (e.ref<=2) {
                    if (e.ref==1) { // original points (end points) - add only once
                        e.edge_point = e.midpoint = Vertex(mesh,id[0])+Vertex(mesh,id[1]);
                        e.midpoint *= 0.5f;
                    }
                    e.edge_point += centroids[FLATTEN_FACE_IDX(t,i)];
                }
            }
        }
    }

    // ---------------------------------------------------------------------
    // 3. Normalize edge points
    // ---------------------------------------------------------------------
    {unsigned int bad_cnt = 0;
    for (EdgeMap::iterator it = edges.begin(); it != edges.end(); ++it) {
        if ((*it).second.ref < 2) {
            ai_assert((*it).second.ref);
            ++bad_cnt;
        }
        (*it).second.edge_point *= 1.f/((*it).second.ref+2.f);
    }

    if (bad_cnt) {
        // Report the number of bad edges. bad edges are referenced by less than two
        // faces in the mesh. They occur at outer model boundaries in non-closed
        // shapes.
        ASSIMP_LOG_DEBUG_F("Catmull-Clark Subdivider: got ", bad_cnt, " bad edges touching only one face (totally ", 
            static_cast<unsigned int>(edges.size()), " edges). ");
    }}

    // ---------------------------------------------------------------------
    // 4. Compute a vertex-face adjacency table. We can't reuse the code
    // from VertexTriangleAdjacency because we need the table for multiple
    // meshes and out vertex indices need to be mapped to distinct values
    // first.
    // ---------------------------------------------------------------------
    UIntVector faceadjac(nfacesout), cntadjfac(maptbl.size(),0), ofsadjvec(maptbl.size()+1,0); {
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                ++cntadjfac[maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]];
            }
        }
    }
    unsigned int cur = 0;
    for (size_t i = 0; i < cntadjfac.size(); ++i) {
        ofsadjvec[i+1] = cur;
        cur += cntadjfac[i];
    }
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                faceadjac[ofsadjvec[1+maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]]++] = FLATTEN_FACE_IDX(t,i);
            }
        }
    }

    // check the other way round for consistency
#ifdef ASSIMP_BUILD_DEBUG

    for (size_t t = 0; t < ofsadjvec.size()-1; ++t) {
        for (unsigned int m = 0; m <  cntadjfac[t]; ++m) {
            const unsigned int fidx = faceadjac[ofsadjvec[t]+m];
            ai_assert(fidx < totfaces);
            for (size_t n = 1; n < nmesh; ++n) {

                if (moffsets[n].first > fidx) {
                    const aiMesh* msh = smesh[--n];
                    const aiFace& f = msh->mFaces[fidx-moffsets[n].first];

                    bool haveit = false;
                    for (unsigned int i = 0; i < f.mNumIndices; ++i) {
                        if (maptbl[FLATTEN_VERTEX_IDX(n,f.mIndices[i])]==(unsigned int)t) {
                            haveit = true;
                            break;
                        }
                    }
                    ai_assert(haveit);
                    if (!haveit) {
                        ASSIMP_LOG_DEBUG("Catmull-Clark Subdivider: Index not used");
                    }
                    break;
                }
            }
        }
    }

#endif
    }

#define GET_ADJACENT_FACES_AND_CNT(vidx,fstartout,numout) \
    fstartout = &faceadjac[ofsadjvec[vidx]], numout = cntadjfac[vidx]

    typedef std::pair<bool,Vertex> TouchedOVertex;
    std::vector<TouchedOVertex > new_points(num_unique,TouchedOVertex(false,Vertex()));
    // ---------------------------------------------------------------------
    // 5. Spawn a quad from each face point to the corresponding edge points
    // the original points being the fourth quad points.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        aiMesh* const mout = out[t] = new aiMesh();

        for (unsigned int a  = 0; a < minp->mNumFaces; ++a) {
            mout->mNumFaces += minp->mFaces[a].mNumIndices;
        }

        // We need random access to the old face buffer, so reuse is not possible.
        mout->mFaces = new aiFace[mout->mNumFaces];

        mout->mNumVertices = mout->mNumFaces*4;
        mout->mVertices = new aiVector3D[mout->mNumVertices];

        // quads only, keep material index
        mout->mPrimitiveTypes = aiPrimitiveType_POLYGON;
        mout->mMaterialIndex = minp->mMaterialIndex;

        if (minp->HasNormals()) {
            mout->mNormals = new aiVector3D[mout->mNumVertices];
        }

        if (minp->HasTangentsAndBitangents()) {
            mout->mTangents = new aiVector3D[mout->mNumVertices];
            mout->mBitangents = new aiVector3D[mout->mNumVertices];
        }

        for(unsigned int i = 0; minp->HasTextureCoords(i); ++i) {
            mout->mTextureCoords[i] = new aiVector3D[mout->mNumVertices];
            mout->mNumUVComponents[i] = minp->mNumUVComponents[i];
        }

        for(unsigned int i = 0; minp->HasVertexColors(i); ++i) {
            mout->mColors[i] = new aiColor4D[mout->mNumVertices];
        }

        mout->mNumVertices = mout->mNumFaces<<2u;
        for (unsigned int i = 0, v = 0, n = 0; i < minp->mNumFaces;++i) {

            const aiFace& face = minp->mFaces[i];
            for (unsigned int a = 0; a < face.mNumIndices;++a)  {

                // Get a clean new face.
                aiFace& faceOut = mout->mFaces[n++];
                faceOut.mIndices = new unsigned int [faceOut.mNumIndices = 4];

                // Spawn a new quadrilateral (ccw winding) for this original point between:
                // a) face centroid
                centroids[FLATTEN_FACE_IDX(t,i)].SortBack(mout,faceOut.mIndices[0]=v++);

                // b) adjacent edge on the left, seen from the centroid
                const Edge& e0 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a==face.mNumIndices-1?0:a+1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                // c) adjacent edge on the right, seen from the centroid
                const Edge& e1 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[!a?face.mNumIndices-1:a-1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                e0.edge_point.SortBack(mout,faceOut.mIndices[3]=v++);
                e1.edge_point.SortBack(mout,faceOut.mIndices[1]=v++);

                // d= original point P with distinct index i
                // F := 0
                // R := 0
                // n := 0
                // for each face f containing i
                //    F := F+ centroid of f
                //    R := R+ midpoint of edge of f from i to i+1
                //    n := n+1
                //
                // (F+2R+(n-3)P)/n
                const unsigned int org = maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])];
                TouchedOVertex& ov = new_points[org];

                if (!ov.first) {
                    ov.first = true;

                    const unsigned int* adj; unsigned int cnt;
                    GET_ADJACENT_FACES_AND_CNT(org,adj,cnt);

                    if (cnt < 3) {
                        ov.second = Vertex(minp,face.mIndices[a]);
                    }
                    else {

                        Vertex F,R;
                        for (unsigned int o = 0; o < cnt; ++o) {
                            ai_assert(adj[o] < totfaces);
                            F += centroids[adj[o]];

                            // adj[0] is a global face index - search the face in the mesh list
                            const aiMesh* mp = NULL;
                            size_t nidx;

                            if (adj[o] < moffsets[0].first) {
                                mp = smesh[nidx=0];
                            }
                            else {
                                for (nidx = 1; nidx<= nmesh; ++nidx) {
                                    if (nidx == nmesh ||moffsets[nidx].first > adj[o]) {
                                        mp = smesh[--nidx];
                                        break;
                                    }
                                }
                            }

                            ai_assert(adj[o]-moffsets[nidx].first < mp->mNumFaces);
                            const aiFace& f = mp->mFaces[adj[o]-moffsets[nidx].first];
                            bool haveit = false;

                            // find our original point in the face
                            for (unsigned int m = 0; m < f.mNumIndices; ++m) {
                                if (maptbl[FLATTEN_VERTEX_IDX(nidx,f.mIndices[m])] == org) {

                                    // add *both* edges. this way, we can be sure that we add
                                    // *all* adjacent edges to R. In a closed shape, every
                                    // edge is added twice - so we simply leave out the
                                    // factor 2.f in the amove formula and get the right
                                    // result.

                                    const Edge& c0 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[!m?f.mNumIndices-1:m-1])])];
                                    // fixme: replace with mod face.mNumIndices?

                                    const Edge& c1 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[m==f.mNumIndices-1?0:m+1])])];
                                    // fixme: replace with mod face.mNumIndices?
                                    R += c0.midpoint+c1.midpoint;

                                    haveit = true;
                                    break;
                                }
                            }

                            // this invariant *must* hold if the vertex-to-face adjacency table is valid
                            ai_assert(haveit);
                            if ( !haveit ) {
                                ASSIMP_LOG_WARN( "OBJ: no name for material library specified." );
                            }
                        }

                        const float div = static_cast<float>(cnt), divsq = 1.f/(div*div);
                        ov.second = Vertex(minp,face.mIndices[a])*((div-3.f) / div) + R*divsq + F*divsq;
                    }
                }
                ov.second.SortBack(mout,faceOut.mIndices[2]=v++);
            }
        }
    }
    }  // end of scope for edges, freeing its memory

    // ---------------------------------------------------------------------
    // 7. Apply the next subdivision step.
    // ---------------------------------------------------------------------
    if (num != 1) {
        std::vector<aiMesh*> tmp(nmesh);
        InternSubdivide (out,nmesh,&tmp.front(),num-1);
        for (size_t i = 0; i < nmesh; ++i) {
            delete out[i];
            out[i] = tmp[i];
        }
    }
}